

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O0

Vec4 __thiscall tcu::RGBA::toVec(RGBA *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RGBA *in_RSI;
  undefined8 extraout_XMM0_Qa;
  ulong uVar5;
  Vec4 VVar6;
  RGBA *this_local;
  
  iVar1 = getRed(in_RSI);
  iVar2 = getGreen(in_RSI);
  iVar3 = getBlue(in_RSI);
  iVar4 = getAlpha(in_RSI);
  uVar5 = (ulong)(uint)((float)iVar2 / 255.0);
  Vector<float,_4>::Vector
            ((Vector<float,_4> *)this,(float)iVar1 / 255.0,(float)iVar2 / 255.0,(float)iVar3 / 255.0
             ,(float)iVar4 / 255.0);
  VVar6.m_data[2] = (float)(int)uVar5;
  VVar6.m_data[3] = (float)(int)(uVar5 >> 0x20);
  VVar6.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar6.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar6.m_data;
}

Assistant:

Vec4 RGBA::toVec (void) const
{
	return Vec4(float(getRed())		/ 255.0f,
				float(getGreen())	/ 255.0f,
				float(getBlue())	/ 255.0f,
				float(getAlpha())	/ 255.0f);
}